

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffitab(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,int tfields,char **ttype,long *tbcol,
          char **tform,char **tunit,char *extnmx,int *status)

{
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  uint in_ECX;
  long in_RDX;
  LONGLONG unaff_RBX;
  long *in_RSI;
  char **in_RDI;
  long *in_R9;
  bool bVar5;
  LONGLONG unaff_retaddr;
  fitsfile *in_stack_00000008;
  long *in_stack_00000010;
  char *in_stack_00000018;
  char **in_stack_00000020;
  char **in_stack_00000028;
  char extnm [71];
  char errmsg [81];
  LONGLONG newstart;
  LONGLONG datasize;
  long rowlen;
  long nblocks;
  int gotmem;
  int ncols;
  int nhead;
  int nunit;
  int ii;
  int maxhdu;
  int nexthdu;
  int *in_stack_00000a10;
  fitsfile *in_stack_00000a18;
  int *in_stack_000015d0;
  int in_stack_000015dc;
  long in_stack_000015e0;
  fitsfile *in_stack_000015e8;
  int *in_stack_fffffffffffffeb8;
  long *in_stack_fffffffffffffec0;
  long *in_stack_fffffffffffffec8;
  uint space;
  char cVar6;
  undefined7 in_stack_fffffffffffffed9;
  int in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffeec;
  LONGLONG in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  fitsfile *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  fitsfile *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  int iVar7;
  int iVar8;
  undefined4 in_stack_ffffffffffffffbc;
  long *local_40;
  int in_stack_fffffffffffffff4;
  int iVar9;
  
  bVar5 = false;
  if (*(int *)in_stack_00000020 < 1) {
    cVar6 = '\0';
    if (in_stack_00000018 != (char *)0x0) {
      strncat(&stack0xfffffffffffffed8,in_stack_00000018,0x46);
    }
    if (*(int *)in_RDI != *(int *)(in_RDI[1] + 0x54)) {
      ffmahd(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10);
    }
    iVar9 = *(int *)(in_RDI[1] + 0x60);
    if ((*(long *)(in_RDI[1] + 0x70) ==
         *(long *)(*(long *)(in_RDI[1] + 0x68) + (long)*(int *)(in_RDI[1] + 0x54) * 8)) ||
       ((*(int *)(in_RDI[1] + 0x54) == iVar9 &&
        (*(long *)(in_RDI[1] + 0x30) <=
         *(long *)(*(long *)(in_RDI[1] + 0x68) + (long)(iVar9 + 1) * 8))))) {
      ffcrtb(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
             in_stack_fffffffffffffeec,
             (char **)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (char **)CONCAT71(in_stack_fffffffffffffed9,cVar6),
             (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
      iVar9 = *(int *)in_stack_00000020;
    }
    else if ((long)in_RSI < 0) {
      *(undefined4 *)in_stack_00000020 = 0xd9;
      iVar9 = 0xd9;
    }
    else if (in_RDX < 0) {
      *(undefined4 *)in_stack_00000020 = 0xda;
      iVar9 = 0xda;
    }
    else if (((int)in_ECX < 0) || (999 < (int)in_ECX)) {
      snprintf(&stack0xffffffffffffff28,0x51,"Illegal value for TFIELDS keyword: %d",(ulong)in_ECX);
      ffpmsg((char *)0x13831a);
      *(undefined4 *)in_stack_00000020 = 0xd8;
      iVar9 = 0xd8;
    }
    else {
      iVar7 = 0;
      for (iVar8 = 0; iVar8 < (int)in_ECX; iVar8 = iVar8 + 1) {
        if (((in_stack_00000010 != (long *)0x0) && (*in_stack_00000010 != 0)) &&
           (*(char *)in_stack_00000010[iVar8] != '\0')) {
          iVar7 = iVar7 + 1;
        }
      }
      if (cVar6 != '\0') {
        iVar7 = iVar7 + 1;
      }
      if (((in_R9 == (long *)0x0) || (*in_R9 == 0)) ||
         ((local_40 = in_R9, in_RSI == (long *)0x0 && (in_ECX != 0)))) {
        space = in_ECX;
        if ((int)in_ECX < 5) {
          space = 5;
        }
        local_40 = (long *)calloc((long)(int)space,8);
        bVar5 = local_40 != (long *)0x0;
        if (bVar5) {
          ffgabc(in_stack_fffffffffffffee0,(char **)CONCAT71(in_stack_fffffffffffffed9,cVar6),space,
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        }
      }
      iVar3 = in_ECX * 3 + iVar7;
      if (*(int *)(in_RDI[1] + 0x5c) == 1) {
        ffrdef((fitsfile *)CONCAT44(in_stack_ffffffffffffffbc,iVar9),(int *)CONCAT44(iVar8,iVar7));
        ffpdfl(in_stack_00000a18,in_stack_00000a10);
        iVar8 = *(int *)(in_RDI[1] + 0x54) + 1;
        uVar1 = *(undefined8 *)(*(long *)(in_RDI[1] + 0x68) + (long)iVar8 * 8);
        pcVar2 = in_RDI[1];
        pcVar2[0x58] = '\x01';
        pcVar2[0x59] = '\0';
        pcVar2[0x5a] = '\0';
        pcVar2[0x5b] = '\0';
        iVar4 = ffiblk(in_stack_000015e8,in_stack_000015e0,in_stack_000015dc,in_stack_000015d0);
        if (iVar4 < 1) {
          *(int *)(in_RDI[1] + 0x60) = *(int *)(in_RDI[1] + 0x60) + 1;
          for (iVar4 = *(int *)(in_RDI[1] + 0x60); *(int *)(in_RDI[1] + 0x54) < iVar4;
              iVar4 = iVar4 + -1) {
            *(undefined8 *)(*(long *)(in_RDI[1] + 0x68) + (long)(iVar4 + 1) * 8) =
                 *(undefined8 *)(*(long *)(in_RDI[1] + 0x68) + (long)iVar4 * 8);
          }
          *(undefined8 *)(*(long *)(in_RDI[1] + 0x68) + (long)iVar8 * 8) = uVar1;
          *(int *)(in_RDI[1] + 0x54) = iVar8;
          *(int *)in_RDI = iVar8;
          *(undefined8 *)(in_RDI[1] + 0x80) =
               *(undefined8 *)(*(long *)(in_RDI[1] + 0x68) + (long)iVar8 * 8);
          *(undefined8 *)(in_RDI[1] + 0x70) =
               *(undefined8 *)(*(long *)(in_RDI[1] + 0x68) + (long)iVar8 * 8);
          *(long *)(in_RDI[1] + 0x88) =
               *(long *)(*(long *)(in_RDI[1] + 0x68) + (long)iVar8 * 8) +
               (long)(((iVar3 + 0x2c) / 0x24) * 0xb40);
          pcVar2 = in_RDI[1];
          pcVar2[0x58] = '\x01';
          pcVar2[0x59] = '\0';
          pcVar2[0x5a] = '\0';
          pcVar2[0x5b] = '\0';
          ffphtb(in_stack_00000008,unaff_retaddr,unaff_RBX,in_stack_fffffffffffffff4,in_RDI,in_RSI,
                 in_stack_00000020,in_stack_00000028,(char *)extnm._0_8_,(int *)extnm._8_8_);
          if (bVar5) {
            free(local_40);
          }
          ffrdef((fitsfile *)CONCAT44(iVar8,iVar9),(int *)CONCAT44(iVar4,iVar7));
          iVar9 = *(int *)in_stack_00000020;
        }
        else {
          if (bVar5) {
            free(local_40);
          }
          iVar9 = *(int *)in_stack_00000020;
        }
      }
      else {
        *(undefined4 *)in_stack_00000020 = 0x70;
        iVar9 = 0x70;
      }
    }
  }
  else {
    iVar9 = *(int *)in_stack_00000020;
  }
  return iVar9;
}

Assistant:

int ffitab(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of row in the table                */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           long *tbcol,     /* I - byte offset in row to each column        */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  insert an ASCII table extension following the current HDU 
*/
{
    int nexthdu, maxhdu, ii, nunit, nhead, ncols, gotmem = 0;
    long nblocks, rowlen;
    LONGLONG datasize, newstart;
    char errmsg[FLEN_ERRMSG], extnm[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    extnm[0] = '\0';
    if (extnmx)
      strncat(extnm, extnmx, FLEN_VALUE-1);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;
    /* if the current header is completely empty ...  */
    if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        /* or, if we are at the end of the file, ... */
    ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
    {
        /* then simply append new image extension */
        ffcrtb(fptr, ASCII_TBL, naxis2, tfields, ttype, tform, tunit,
               extnm, status);
        return(*status);
    }

    if (naxis1 < 0)
        return(*status = NEG_WIDTH);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for TFIELDS keyword: %d", tfields);
        ffpmsg(errmsg);
        return(*status = BAD_TFIELDS);
    }

    /* count number of optional TUNIT keywords to be written */
    nunit = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        if (tunit && *tunit && *tunit[ii])
            nunit++;
    }

    if (*extnm)
         nunit++;     /* add one for the EXTNAME keyword */

    rowlen = (long) naxis1;

    if (!tbcol || !tbcol[0] || (!naxis1 && tfields)) /* spacing not defined? */
    {
      /* allocate mem for tbcol; malloc may have problems allocating small */
      /* arrays, so allocate at least 20 bytes */

      ncols = maxvalue(5, tfields);
      tbcol = (long *) calloc(ncols, sizeof(long));

      if (tbcol)
      {
        gotmem = 1;

        /* calculate width of a row and starting position of each column. */
        /* Each column will be separated by 1 blank space */
        ffgabc(tfields, tform, 1, &rowlen, tbcol, status);
      }
    }

    nhead = (9 + (3 * tfields) + nunit + 35) / 36;  /* no. of header blocks */
    datasize = (LONGLONG)rowlen * naxis2;          /* size of table in bytes */
    nblocks = (long) (((datasize + 2879) / 2880) + nhead);  /* size of HDU */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
    newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

    (fptr->Fptr)->hdutype = ASCII_TBL;  /* so that correct fill value is used */
    /* ffiblk also increments headstart for all following HDUs */
    if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
    {
        if (gotmem)
            free(tbcol); 
        return(*status);
    }

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + (nhead * 2880);
    (fptr->Fptr)->hdutype = ASCII_TBL;  /* might need to be reset... */

    /* write the required header keywords */

    ffphtb(fptr, rowlen, naxis2, tfields, ttype, tbcol, tform, tunit,
           extnm, status);

    if (gotmem)
        free(tbcol); 

    /* redefine internal structure for this HDU */

    ffrdef(fptr, status);
    return(*status);
}